

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer.h
# Opt level: O0

void __thiscall rengine::OpenGLRenderer::activateShader(OpenGLRenderer *this,Program *shader)

{
  GLuint GVar1;
  int local_34;
  int local_28;
  int local_24;
  int i_1;
  int i;
  int newCount;
  int oldCount;
  Program *shader_local;
  OpenGLRenderer *this_local;
  
  if (shader != this->m_activeShader) {
    if (this->m_activeShader == (Program *)0x0) {
      local_34 = 0;
    }
    else {
      local_34 = OpenGLShaderProgram::attributeCount
                           (&this->m_activeShader->super_OpenGLShaderProgram);
    }
    i_1 = 0;
    if (shader == (Program *)0x0) {
      glUseProgram(0);
    }
    else {
      i_1 = OpenGLShaderProgram::attributeCount(&shader->super_OpenGLShaderProgram);
      GVar1 = OpenGLShaderProgram::id(&shader->super_OpenGLShaderProgram);
      glUseProgram(GVar1);
    }
    for (local_24 = local_34; local_28 = local_34, local_24 < i_1; local_24 = local_24 + 1) {
      glEnableVertexAttribArray(local_24);
    }
    while (local_28 = local_28 + -1, i_1 <= local_28) {
      glDisableVertexAttribArray(local_28);
    }
    this->m_activeShader = shader;
  }
  return;
}

Assistant:

inline void OpenGLRenderer::activateShader(const Program *shader)
{
    if (shader == m_activeShader)
        return;

    int oldCount = m_activeShader ? m_activeShader->attributeCount() : 0;
    int newCount = 0;

    if (shader) {
        newCount = shader->attributeCount();
        glUseProgram(shader->id());
    } else {
        glUseProgram(0);
    }

    // std::cout << " --- switching shader: old=" << (m_activeShader ? m_activeShader->id() : 0)
    //           << " (" << oldCount << " attr)"
    //           << " new=" << (shader ? shader->id() : 0)
    //           << " (" << newCount << " attr)"
    //           << std::endl;

    // Enable new ones
    for (int i=oldCount; i<newCount; ++i) {
        // std::cout << "    - enable " << i << estd::ndl;
        glEnableVertexAttribArray(i);
    }
    for (int i=oldCount-1; i>=newCount; --i) {
        // std::cout << "    - disable " << i << std::endl;
        glDisableVertexAttribArray(i);
    }

    m_activeShader = shader;
}